

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

int i4_choose(int n,int k)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  iVar2 = i4_min(k,n - k);
  if (iVar2 < 0) {
    uVar4 = 0;
  }
  else if (iVar2 == 0) {
    uVar4 = 1;
  }
  else {
    iVar3 = i4_max(k,n - k);
    uVar4 = iVar3 + 1;
    uVar5 = (ulong)uVar4;
    if (iVar2 != 1) {
      iVar6 = 2;
      do {
        uVar1 = (long)((iVar3 + iVar6) * (int)uVar5) / (long)iVar6;
        uVar5 = uVar1 & 0xffffffff;
        uVar4 = (uint)uVar1;
        bVar7 = iVar6 != iVar2;
        iVar6 = iVar6 + 1;
      } while (bVar7);
    }
  }
  return uVar4;
}

Assistant:

BURKHARDT_EXPORT
int i4_choose ( int n, int k )

//****************************************************************************80
//
//  Purpose:
//
//    I4_CHOOSE computes the binomial coefficient C(N,K).
//
//  Discussion:
//
//    The value is calculated in such a way as to avoid overflow and
//    roundoff.  The calculation is done in integer arithmetic.
//
//    The formula used is:
//
//      C(N,K) = N! / ( K! * (N-K)! )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    02 June 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    ML Wolfson, HV Wright,
//    Algorithm 160:
//    Combinatorial of M Things Taken N at a Time,
//    Communications of the ACM,
//    Volume 6, Number 4, April 1963, page 161.
//
//  Parameters:
//
//    Input, int N, K, are the values of N and K.
//
//    Output, int I4_CHOOSE, the number of combinations of N
//    things taken K at a time.
//
{
  int i;
  int mn;
  int mx;
  int value;

  mn = i4_min ( k, n - k );

  if ( mn < 0 )
  {
    value = 0;
  }
  else if ( mn == 0 )
  {
    value = 1;
  }
  else
  {
    mx = i4_max ( k, n - k );
    value = mx + 1;

    for ( i = 2; i <= mn; i++ )
    {
      value = ( value * ( mx + i ) ) / i;
    }
  }

  return value;
}